

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

unique_ptr<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>_> __thiscall
anon_unknown.dwarf_196123d::CreateInstallFilesGenerator
          (anon_unknown_dwarf_196123d *this,cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles,cmInstallCommandArguments *args,bool programs,string *destination)

{
  _Head_base<0UL,_cmInstallFilesGenerator_*,_false> __args;
  string *__args_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_5;
  string *__args_9;
  undefined1 local_67;
  bool programs_local;
  undefined1 local_65;
  MessageLevel message;
  string *local_60;
  _Head_base<0UL,_cmInstallFilesGenerator_*,_false> local_58;
  undefined8 local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  programs_local = programs;
  local_58._M_head_impl = (cmInstallFilesGenerator *)this;
  local_50 = absFiles;
  local_48 = destination;
  message = cmInstallGenerator::SelectMessageLevel(mf,false);
  __args_4 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  __args_5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  local_60 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  local_67 = cmInstallCommandArguments::GetExcludeFromAll(args);
  __args_9 = cmInstallCommandArguments::GetRename_abi_cxx11_(args);
  local_65 = cmInstallCommandArguments::GetOptional(args);
  __args._M_head_impl = local_58._M_head_impl;
  cmMakefile::GetBacktrace(mf);
  std::
  make_unique<cmInstallFilesGenerator,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,bool&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string_const&,bool,cmListFileBacktrace>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__args._M_head_impl,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (bool *)local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&programs_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)__args_4,__args_5,(MessageLevel *)local_60,(bool *)&message,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_67,
             (bool *)__args_9,(cmListFileBacktrace *)&local_65);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return (__uniq_ptr_data<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>,_true,_true>
          )(__uniq_ptr_data<cmInstallFilesGenerator,_std::default_delete<cmInstallFilesGenerator>,_true,_true>
            )__args._M_head_impl;
}

Assistant:

std::unique_ptr<cmInstallFilesGenerator> CreateInstallFilesGenerator(
  cmMakefile* mf, const std::vector<std::string>& absFiles,
  const cmInstallCommandArguments& args, bool programs,
  const std::string& destination)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(mf);
  return cm::make_unique<cmInstallFilesGenerator>(
    absFiles, destination, programs, args.GetPermissions(),
    args.GetConfigurations(), args.GetComponent(), message,
    args.GetExcludeFromAll(), args.GetRename(), args.GetOptional(),
    mf->GetBacktrace());
}